

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::StatsdPullAtomConfig::operator==
          (StatsdPullAtomConfig *this,StatsdPullAtomConfig *other)

{
  AtomId *pAVar1;
  pointer __s1;
  pointer piVar2;
  pointer __s2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first2;
  bool bVar3;
  int iVar4;
  AtomId *pAVar5;
  pointer pAVar6;
  size_t sVar7;
  
  sVar7 = (this->unknown_fields_)._M_string_length;
  if (sVar7 == (other->unknown_fields_)._M_string_length) {
    if ((sVar7 != 0) &&
       (iVar4 = bcmp((this->unknown_fields_)._M_dataplus._M_p,
                     (other->unknown_fields_)._M_dataplus._M_p,sVar7), iVar4 != 0)) {
      return false;
    }
    pAVar5 = (this->pull_atom_id_).
             super__Vector_base<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar1 = (this->pull_atom_id_).
             super__Vector_base<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pAVar6 = (other->pull_atom_id_).
             super__Vector_base<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pAVar1 - (long)pAVar5 ==
        (long)(other->pull_atom_id_).
              super__Vector_base<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6) {
      for (; pAVar5 != pAVar1; pAVar5 = pAVar5 + 1) {
        if (*pAVar5 != *pAVar6) {
          return false;
        }
        pAVar6 = pAVar6 + 1;
      }
      __s1 = (this->raw_pull_atom_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
      piVar2 = (this->raw_pull_atom_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      sVar7 = (long)piVar2 - (long)__s1;
      __s2 = (other->raw_pull_atom_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
      if (sVar7 == (long)(other->raw_pull_atom_id_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)__s2) {
        if ((piVar2 != __s1) && (iVar4 = bcmp(__s1,__s2,sVar7), iVar4 != 0)) {
          return false;
        }
        if (this->pull_frequency_ms_ == other->pull_frequency_ms_) {
          __first1 = (this->packages_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          __last1 = (this->packages_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          __first2 = (other->packages_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if ((long)__last1 - (long)__first1 ==
              (long)(other->packages_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) {
            bVar3 = ::std::__equal<false>::
                    equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                              (__first1,__last1,__first2);
            return bVar3;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

T&& value() && {
    PERFETTO_CHECK(storage_.is_populated_);
    return std::move(storage_.value_);
  }